

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

int SoapySDRDevice_setGainMode(SoapySDRDevice *device,int direction,size_t channel,bool automatic)

{
  undefined1 *puVar1;
  undefined7 in_register_00000009;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_00141f38);
  *(undefined4 *)(puVar1 + 0x400) = 0;
  *puVar1 = 0;
  (**(code **)(*(long *)device + 0x160))
            (device,direction,channel,CONCAT71(in_register_00000009,automatic) & 0xffffffff);
  return 0;
}

Assistant:

int SoapySDRDevice_setGainMode(SoapySDRDevice *device, const int direction, const size_t channel, const bool automatic)
{
    __SOAPY_SDR_C_TRY
    device->setGainMode(direction, channel, automatic);
    __SOAPY_SDR_C_CATCH
}